

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie.h
# Opt level: O1

void __thiscall puppup::trie::Gaddag::Gaddag(Gaddag *this,istream *fin)

{
  pointer *ppvVar1;
  iterator __position;
  pointer pvVar2;
  iterator iVar3;
  iterator __position_00;
  pointer plVar4;
  pointer plVar5;
  bool bVar6;
  vector<long,std::allocator<long>> *this_00;
  char *pcVar7;
  char cVar8;
  idx i;
  long lVar9;
  istream *piVar10;
  ostream *poVar11;
  ulong uVar12;
  pointer pNVar13;
  long lVar14;
  size_type sVar15;
  size_type sVar16;
  nodeid nVar17;
  long lVar18;
  chr child_chr;
  chr child_chr_1;
  pointer plVar19;
  long lVar20;
  undefined8 extraout_XMM0_Qa;
  undefined1 auVar21 [64];
  undefined1 extraout_var [56];
  string s;
  array<long,_26UL> stridx;
  long alStack_408 [83];
  undefined8 uStack_170;
  vector<puppup::trie::Gaddag::Node,_std::allocator<puppup::trie::Gaddag::Node>_> *local_168;
  vector<long,std::allocator<long>> *local_160;
  vector<long,_std::allocator<long>_> *local_158;
  vector<long,_std::allocator<long>_> *local_150;
  vector<long,_std::allocator<long>_> *local_148;
  long local_140;
  char *local_138;
  size_type local_130;
  char local_128;
  undefined7 uStack_127;
  long local_118;
  long local_110;
  long local_108;
  undefined1 auVar22 [64];
  
  local_168 = &this->nodes_;
  local_148 = &this->next_sibling_;
  local_158 = &this->first_child_;
  local_150 = &this->val_;
  auVar21 = ZEXT1664((undefined1  [16])0x0);
  auVar22 = vmovdqu64_avx512f(auVar21);
  *(undefined1 (*) [64])
   &(this->next_sibling_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data._M_finish = auVar22;
  auVar22 = vmovdqu64_avx512f(auVar21);
  *(undefined1 (*) [64])
   &(this->node_to_word_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = auVar22;
  auVar22 = vmovdqu64_avx512f(auVar21);
  this->words_ = (vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                  )auVar22._0_24_;
  this->nodes_ = (vector<puppup::trie::Gaddag::Node,_std::allocator<puppup::trie::Gaddag::Node>_>)
                 auVar22._24_24_;
  (this->node_to_word_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)auVar22._48_8_;
  (this->node_to_word_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)auVar22._56_8_;
  lVar9 = 0;
  do {
    alStack_408["eiaontrsuldgywvpmhfcbzxqkj_    +"[lVar9]] = lVar9;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x1a);
  local_138 = &local_128;
  local_130 = 0;
  local_128 = '\0';
  uStack_170 = 0x107402;
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::reserve(&this->words_,200000);
  do {
    uStack_170 = 0x107417;
    cVar8 = std::ios::widen((char)*(undefined8 *)(*(long *)fin + -0x18) + (char)fin);
    auVar22._8_56_ = extraout_var;
    auVar22._0_8_ = extraout_XMM0_Qa;
    uStack_170 = 0x107427;
    piVar10 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                        (fin,(string *)&local_138,cVar8);
    if (((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) != 0) {
      uStack_170 = 0x10756b;
      std::vector<puppup::trie::Gaddag::Node,_std::allocator<puppup::trie::Gaddag::Node>_>::reserve
                (local_168,
                 ((long)(this->words_).
                        super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->words_).
                        super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x5555555555555557);
      __position_00._M_current =
           (this->nodes_).
           super__Vector_base<puppup::trie::Gaddag::Node,_std::allocator<puppup::trie::Gaddag::Node>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position_00._M_current ==
          (this->nodes_).
          super__Vector_base<puppup::trie::Gaddag::Node,_std::allocator<puppup::trie::Gaddag::Node>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        uStack_170 = 0x1075ad;
        std::vector<puppup::trie::Gaddag::Node,_std::allocator<puppup::trie::Gaddag::Node>_>::
        _M_realloc_insert<>(local_168,__position_00);
      }
      else {
        auVar21 = vpternlogd_avx512f(auVar22,auVar22,auVar22,0xff);
        auVar22 = vmovdqu64_avx512f(auVar21);
        *(undefined1 (*) [64])(((__position_00._M_current)->children)._M_elems + 0x18) = auVar22;
        auVar22 = vmovdqu64_avx512f(auVar21);
        *(undefined1 (*) [64])(((__position_00._M_current)->children)._M_elems + 0x10) = auVar22;
        auVar22 = vmovdqu64_avx512f(auVar21);
        *(undefined1 (*) [64])(((__position_00._M_current)->children)._M_elems + 8) = auVar22;
        auVar22 = vmovdqu64_avx512f(auVar21);
        *(undefined1 (*) [64])((__position_00._M_current)->children)._M_elems = auVar22;
        (this->nodes_).
        super__Vector_base<puppup::trie::Gaddag::Node,_std::allocator<puppup::trie::Gaddag::Node>_>.
        _M_impl.super__Vector_impl_data._M_finish = __position_00._M_current + 1;
      }
      uStack_170 = 0x1075c7;
      std::vector<long,_std::allocator<long>_>::reserve
                (&this->node_to_word_,
                 ((long)(this->words_).
                        super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->words_).
                        super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x5555555555555557);
      uVar12 = (long)(this->words_).
                     super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->words_).
                     super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      if (0 < (long)uVar12) {
        lVar9 = (uVar12 >> 3) * -0x5555555555555555;
        local_118 = 1;
        if (1 < lVar9) {
          local_118 = lVar9;
        }
        lVar9 = 0;
        local_160 = (vector<long,std::allocator<long>> *)&this->node_to_word_;
        do {
          pvVar2 = (this->words_).
                   super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar20 = (long)*(pointer *)
                          ((long)&pvVar2[lVar9].super__Vector_base<long,_std::allocator<long>_>.
                                  _M_impl + 8) -
                   *(long *)&pvVar2[lVar9].super__Vector_base<long,_std::allocator<long>_>._M_impl
                   >> 3;
          if (-1 < lVar20) {
            pvVar2 = pvVar2 + lVar9;
            local_140 = -1;
            lVar14 = 0;
            local_110 = lVar9;
            do {
              local_108 = lVar14;
              if (local_140 < 0) {
                nVar17 = 0;
              }
              else {
                nVar17 = 0;
                do {
                  lVar9 = *(long *)(*(long *)&(pvVar2->
                                              super__Vector_base<long,_std::allocator<long>_>).
                                              _M_impl + -8 + lVar14 * 8);
                  uStack_170 = 0x107658;
                  add(this,nVar17,lVar9);
                  nVar17 = (local_168->
                           super__Vector_base<puppup::trie::Gaddag::Node,_std::allocator<puppup::trie::Gaddag::Node>_>
                           )._M_impl.super__Vector_impl_data._M_start[nVar17].children._M_elems
                           [lVar9];
                  lVar9 = lVar14 + -1;
                  bVar6 = 0 < lVar14;
                  lVar14 = lVar9;
                } while (lVar9 != 0 && bVar6);
              }
              uStack_170 = 0x107681;
              add(this,nVar17,0x1f);
              lVar9 = local_140 + 1;
              nVar17 = (local_168->
                       super__Vector_base<puppup::trie::Gaddag::Node,_std::allocator<puppup::trie::Gaddag::Node>_>
                       )._M_impl.super__Vector_impl_data._M_start[nVar17].children._M_elems[0x1f];
              local_140 = lVar9;
              if (lVar9 < lVar20) {
                do {
                  lVar14 = *(long *)(*(long *)&(pvVar2->
                                               super__Vector_base<long,_std::allocator<long>_>).
                                               _M_impl + lVar9 * 8);
                  uStack_170 = 0x1076be;
                  add(this,nVar17,lVar14);
                  lVar9 = lVar9 + 1;
                  nVar17 = (local_168->
                           super__Vector_base<puppup::trie::Gaddag::Node,_std::allocator<puppup::trie::Gaddag::Node>_>
                           )._M_impl.super__Vector_impl_data._M_start[nVar17].children._M_elems
                           [lVar14];
                } while (lVar20 != lVar9);
              }
              this_00 = local_160;
              plVar4 = (this->node_to_word_).super__Vector_base<long,_std::allocator<long>_>._M_impl
                       .super__Vector_impl_data._M_start;
              iVar3._M_current =
                   (this->node_to_word_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              lVar14 = (long)iVar3._M_current - (long)plVar4;
              lVar9 = local_110;
              while (local_110 = lVar9, lVar14 >> 3 <= nVar17) {
                if (iVar3._M_current ==
                    (this->node_to_word_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  uStack_170 = 0x10771b;
                  std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                            (this_00,iVar3,&invalid);
                }
                else {
                  *iVar3._M_current = -1;
                  (this->node_to_word_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_finish = iVar3._M_current + 1;
                }
                plVar4 = (this->node_to_word_).super__Vector_base<long,_std::allocator<long>_>.
                         _M_impl.super__Vector_impl_data._M_start;
                iVar3._M_current =
                     (this->node_to_word_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                lVar9 = local_110;
                lVar14 = (long)iVar3._M_current - (long)plVar4;
              }
              plVar4[nVar17] = lVar9;
              lVar14 = local_108 + 1;
            } while (local_140 != lVar20);
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 != local_118);
      }
      sVar15 = (long)(this->nodes_).
                     super__Vector_base<puppup::trie::Gaddag::Node,_std::allocator<puppup::trie::Gaddag::Node>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->nodes_).
                     super__Vector_base<puppup::trie::Gaddag::Node,_std::allocator<puppup::trie::Gaddag::Node>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 8;
      uStack_170 = 0x107778;
      std::vector<long,_std::allocator<long>_>::resize(local_148,sVar15);
      uStack_170 = 0x107785;
      std::vector<long,_std::allocator<long>_>::resize(local_158,sVar15);
      uStack_170 = 0x107792;
      std::vector<long,_std::allocator<long>_>::resize(local_150,sVar15);
      if (0 < (long)sVar15) {
        pNVar13 = (local_168->
                  super__Vector_base<puppup::trie::Gaddag::Node,_std::allocator<puppup::trie::Gaddag::Node>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        plVar4 = (local_158->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        plVar5 = (local_148->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        sVar16 = 0;
        do {
          plVar19 = (local_150->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          lVar9 = 0;
          do {
            lVar20 = (pNVar13->children)._M_elems[lVar9];
            if (lVar20 != -1) {
              plVar19[lVar20] = lVar9;
            }
            lVar9 = lVar9 + 1;
          } while (lVar9 != 0x20);
          lVar9 = 0;
          do {
            lVar20 = (pNVar13->children)._M_elems[lVar9];
            if (lVar20 != -1) {
              plVar4[sVar16] = lVar20;
              break;
            }
            lVar9 = lVar9 + 1;
          } while (lVar9 != 0x20);
          plVar19 = (local_148->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          lVar20 = 0;
          lVar9 = -1;
          do {
            lVar14 = (pNVar13->children)._M_elems[lVar20];
            lVar18 = lVar9;
            if ((lVar14 != -1) && (lVar18 = lVar14, lVar9 != -1)) {
              plVar19[lVar9] = lVar14;
            }
            lVar20 = lVar20 + 1;
            lVar9 = lVar18;
          } while (lVar20 != 0x20);
          plVar19 = plVar5 + lVar18;
          if (lVar18 == -1) {
            plVar19 = plVar4 + sVar16;
          }
          *plVar19 = -1;
          sVar16 = sVar16 + 1;
          pNVar13 = pNVar13 + 1;
        } while (sVar16 != sVar15);
      }
      if (local_138 != &local_128) {
        uStack_170 = 0x107863;
        operator_delete(local_138,CONCAT71(uStack_127,local_128) + 1);
      }
      return;
    }
    if (local_130 != 0) {
      sVar15 = 0;
      do {
        if ((byte)(local_138[sVar15] + 0xbfU) < 0x1a) {
          local_138[sVar15] = local_138[sVar15] | 0x20;
        }
        if ((byte)(local_138[sVar15] + 0x85U) < 0xe6) {
          uStack_170 = 0x10748d;
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,local_138,local_130);
          uStack_170 = 0x1074a4;
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
          uStack_170 = 0x1074af;
          std::ostream::put((char)poVar11);
          uStack_170 = 0x1074b7;
          std::ostream::flush();
          break;
        }
        sVar15 = sVar15 + 1;
      } while (local_130 != sVar15);
    }
    __position._M_current =
         (this->words_).
         super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->words_).
        super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      uStack_170 = 0x1074e0;
      std::
      vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
      ::_M_realloc_insert<>(&this->words_,__position);
    }
    else {
      ((__position._M_current)->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      ((__position._M_current)->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      ((__position._M_current)->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ppvVar1 = &(this->words_).
                 super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppvVar1 = *ppvVar1 + 1;
    }
    uStack_170 = 0x1074f2;
    std::vector<long,_std::allocator<long>_>::reserve
              ((this->words_).
               super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1,local_130);
    sVar15 = local_130;
    pcVar7 = local_138;
    if (local_130 != 0) {
      sVar16 = 0;
      do {
        pvVar2 = (this->words_).
                 super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        iVar3._M_current =
             pvVar2[-1].super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            pvVar2[-1].super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          uStack_170 = 0x10753c;
          std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                    ((vector<long,std::allocator<long>> *)(pvVar2 + -1),iVar3,
                     alStack_408 + pcVar7[sVar16]);
        }
        else {
          *iVar3._M_current = alStack_408[pcVar7[sVar16]];
          pvVar2[-1].super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
          ._M_finish = iVar3._M_current + 1;
        }
        sVar16 = sVar16 + 1;
      } while (sVar15 != sVar16);
    }
  } while( true );
}

Assistant:

explicit Gaddag(std::istream& fin) {
        std::array<idx, 26> stridx;
        for (idx i = 0; i < 26; ++i) {
            stridx[idxstr[i] - 'a'] = i;
        }
        std::string s;
        words_.reserve(200'000);
        while (std::getline(fin, s)) {
            for (char& c : s) {
                if (c >= 'A' && c <= 'Z') {
                    c += 'a' - 'A';
                }
                if (c < 'a' || c > 'z') {
                    std::cerr << s << std::endl;
                    break;
                }
            }
            words_.emplace_back();
            words_.back().reserve(s.length());
            for (char c : s) {
                words_.back().push_back(stridx[c - 'a']);
            }
        }
        nodes_.reserve(5 * words_.size());
        nodes_.emplace_back();  // root
        node_to_word_.reserve(5 * words_.size());
        for (idx w = 0, wn = words_.size(); w < wn; ++w) {
            const auto& word = words_[w];
            const idx n = word.size();
            for (idx start = -1; start < n; ++start) {
                nodeid curr = 0;
                for (idx j = start; j >= 0; --j) {
                    const chr i = word[j];
                    add(curr, i);
                    curr = get(curr, i);
                }
                add(curr, rev_marker);
                curr = get(curr, rev_marker);
                for (idx j = start + 1; j < n; ++j) {
                    const chr i = word[j];
                    add(curr, i);
                    curr = get(curr, i);
                }
                while (curr >= idx(node_to_word_.size())) {
                    node_to_word_.push_back(invalid);
                }
                node_to_word_[curr] = w;
            }
        }
        const nodeid n_nodes = nodes_.size();
        next_sibling_.resize(n_nodes);
        first_child_.resize(n_nodes);
        val_.resize(n_nodes);
        for (nodeid node = 0; node < n_nodes; ++node) {
            for (chr child_chr = 0; child_chr < 32; ++child_chr) {
                nodeid child = get(node, child_chr);
                if (child != invalid) {
                    val_[child] = child_chr;
                }
            }
            for (chr child_chr = 0; child_chr < 32; ++child_chr) {
                nodeid child = get(node, child_chr);
                if (child != invalid) {
                    first_child_[node] = child;
                    break;
                }
            }
            nodeid last = invalid;
            for (chr child_chr = 0; child_chr < 32; ++child_chr) {
                nodeid child = get(node, child_chr);
                if (child != invalid) {
                    if (last != invalid) {
                        next_sibling_[last] = child;
                    }
                    last = child;
                }
            }
            if (last != invalid) {
                next_sibling_[last] = invalid;
            } else {
                first_child_[node] = invalid;
            }
        }
    }